

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

InnerProductLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  InnerProductLayerParams *pIVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_innerproduct(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_innerproduct(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pIVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(arena);
    (this->layer_).innerproduct_ = pIVar2;
  }
  return (InnerProductLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::InnerProductLayerParams* NeuralNetworkLayer::_internal_mutable_innerproduct() {
  if (!_internal_has_innerproduct()) {
    clear_layer();
    set_has_innerproduct();
    layer_.innerproduct_ = CreateMaybeMessage< ::CoreML::Specification::InnerProductLayerParams >(GetArenaForAllocation());
  }
  return layer_.innerproduct_;
}